

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

float __thiscall nv::SincFilter::evaluate(SincFilter *this,float x)

{
  float fVar1;
  float x_local;
  SincFilter *this_local;
  
  fVar1 = anon_unknown.dwarf_469c36::sincf(x * 3.1415927);
  return fVar1;
}

Assistant:

float SincFilter::evaluate(float x) const
{
	return sincf(PI * x);
}